

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_io.c
# Opt level: O3

int CVodeSetEtaMaxFirstStep(void *cvode_mem,realtype eta_max_fs)

{
  int iVar1;
  
  if (cvode_mem == (void *)0x0) {
    iVar1 = -0x15;
    cvProcessError((CVodeMem)0x0,-0x15,"CVODE","CVodeSetEtaMaxFirstStep","cvode_mem = NULL illegal."
                  );
  }
  else {
    if (eta_max_fs <= 1.0) {
      *(undefined8 *)((long)cvode_mem + 0x310) = 0x40c3880000000000;
    }
    else {
      *(realtype *)((long)cvode_mem + 0x310) = eta_max_fs;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int CVodeSetEtaMaxFirstStep(void* cvode_mem, realtype eta_max_fs)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL) {
    cvProcessError(NULL, CV_MEM_NULL, "CVODE", "CVodeSetEtaMaxFirstStep",
                   MSGCV_NO_MEM);
    return (CV_MEM_NULL);
  }

  cv_mem = (CVodeMem) cvode_mem;

  /* set allowed value or use default */
  if (eta_max_fs <= ONE)
    cv_mem->cv_eta_max_fs = ETA_MAX_FS_DEFAULT;
  else
    cv_mem->cv_eta_max_fs = eta_max_fs;

  return(CV_SUCCESS);
}